

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O1

void __thiscall wabt::BindingHash::FindDuplicates(BindingHash *this,DuplicateCallback *callback)

{
  _Manager_type p_Var1;
  _Any_data *p_Var2;
  ValueTypeVector duplicates;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  ValueTypeVector local_28;
  
  if ((this->
      super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
      )._M_h._M_element_count != 0) {
    p_Var2 = &local_48;
    local_28.
    super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.
    super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.
    super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CreateDuplicatesVector(this,&local_28);
    SortDuplicatesVectorByLocation(this,&local_28);
    local_38 = (_Manager_type)0x0;
    p_Stack_30 = (_Invoker_type)0x0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    p_Var1 = (callback->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)(&local_48,(_Any_data *)callback,__clone_functor);
      p_Stack_30 = callback->_M_invoker;
      local_38 = (callback->super__Function_base)._M_manager;
      this = (BindingHash *)p_Var2;
    }
    CallCallbacks(this,&local_28,(DuplicateCallback *)&local_48);
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_28.
        super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_28.
                      super__Vector_base<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void BindingHash::FindDuplicates(DuplicateCallback callback) const {
  if (size() > 0) {
    ValueTypeVector duplicates;
    CreateDuplicatesVector(&duplicates);
    SortDuplicatesVectorByLocation(&duplicates);
    CallCallbacks(duplicates, callback);
  }
}